

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

bool __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
::try_merge_or_rebalance
          (btree<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
           *this,iterator *iter)

{
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  bVar1;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  bVar2;
  int iVar3;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *pbVar4;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  bVar5;
  byte bVar6;
  byte bVar7;
  field_type fVar8;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  bVar9;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *pbVar10;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *this_00;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *pbVar11;
  char *__function;
  uint uVar12;
  
  pbVar4 = iter->node_;
  if (((ulong)pbVar4 & 7) != 0) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descripto..." /* TRUNCATED STRING LITERAL */
    ;
    goto LAB_00217d82;
  }
  pbVar11 = *(btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              **)pbVar4;
  bVar1 = pbVar4[8];
  bVar5 = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
           )btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            ::start(pbVar11);
  if ((byte)bVar5 < (byte)bVar1) {
    if ((((ulong)iter->node_ & 7) == 0) &&
       (pbVar10 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  ::child(pbVar11,(char)iter->node_[8] + 0xff), ((ulong)pbVar10 & 7) == 0)) {
      if ((pbVar10[0xb] !=
           (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            )0x0) &&
         (pbVar10[0xb] !=
          (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
           )0xa)) {
        __assert_fail("left->max_count() == kNodeSlots",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0xaa7,
                      "bool absl::container_internal::btree<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>]"
                     );
      }
      bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              ::count(pbVar10);
      bVar7 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              ::count((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                       *)iter->node_);
      if ((uint)bVar7 + (uint)bVar6 + 1 < 0xb) {
        bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                ::count(pbVar10);
        iter->position_ = (uint)bVar6 + iter->position_ + 1;
        pbVar11 = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                   *)iter->node_;
        btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
        ::merge(pbVar10,pbVar11,(allocator_type *)&this->rightmost_);
        if ((this->rightmost_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::pair<const_google::protobuf::Descriptor_*,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            .
            super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
            .value == pbVar11) {
          (this->rightmost_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::pair<const_google::protobuf::Descriptor_*,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
          .
          super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
          .value = pbVar10;
        }
        iter->node_ = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                       *)pbVar10;
        return true;
      }
      goto LAB_00217b18;
    }
  }
  else {
LAB_00217b18:
    pbVar10 = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
               *)iter->node_;
    if ((((ulong)pbVar10 & 7) == 0) && (((ulong)pbVar11 & 7) == 0)) {
      if ((byte)pbVar10[8] < (byte)pbVar11[10]) {
        this_00 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  ::child(pbVar11,(char)pbVar10[8] + 1);
        if (((ulong)this_00 & 7) != 0) goto LAB_00217d56;
        if ((this_00[0xb] !=
             (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              )0x0) &&
           (this_00[0xb] !=
            (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
             )0xa)) {
          __assert_fail("right->max_count() == kNodeSlots",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                        ,0xab2,
                        "bool absl::container_internal::btree<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>]"
                       );
        }
        bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                ::count((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                         *)iter->node_);
        bVar7 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                ::count(this_00);
        if ((uint)bVar7 + (uint)bVar6 + 1 < 0xb) {
          pbVar11 = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                     *)iter->node_;
          btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
          ::merge(pbVar11,this_00,(allocator_type *)&this->rightmost_);
          if ((this->rightmost_).
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::pair<const_google::protobuf::Descriptor_*,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              .
              super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
              .value == this_00) {
            (this->rightmost_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::pair<const_google::protobuf::Descriptor_*,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            .
            super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
            .value = pbVar11;
            return true;
          }
          return true;
        }
        bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                ::count(this_00);
        pbVar10 = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                   *)iter->node_;
        if (5 < bVar6) {
          fVar8 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  ::count(pbVar10);
          if ((fVar8 == '\0') ||
             (iVar3 = iter->position_,
             bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                     ::start((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                              *)iter->node_), (int)(uint)bVar6 < iVar3)) {
            bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::count(this_00);
            bVar7 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::count((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                             *)iter->node_);
            fVar8 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::count(this_00);
            bVar6 = (byte)(((((uint)bVar6 - (uint)bVar7 & 0xffff) >> 0xf) +
                            ((uint)bVar6 - (uint)bVar7) & 0xffff) >> 1);
            if ((byte)(fVar8 - 1) < bVar6) {
              bVar6 = fVar8 - 1;
            }
            btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            ::rebalance_right_to_left
                      ((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                        *)iter->node_,bVar6,this_00,(allocator_type *)&this->rightmost_);
            return false;
          }
          pbVar10 = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                     *)iter->node_;
        }
      }
      if (((ulong)pbVar10 & 7) == 0) {
        bVar2 = pbVar10[8];
        bVar9 = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                 )btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  ::start(pbVar11);
        if ((byte)bVar2 <= (byte)bVar9) {
          return false;
        }
        if (((ulong)iter->node_ & 7) == 0) {
          pbVar11 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::child(pbVar11,(char)iter->node_[8] + 0xff);
          bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  ::count(pbVar11);
          if (bVar6 < 6) {
            return false;
          }
          fVar8 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  ::count((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                           *)iter->node_);
          if (fVar8 == '\0') {
LAB_00217ce5:
            bVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::count(pbVar11);
            bVar7 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::count((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                             *)iter->node_);
            uVar12 = ((((uint)bVar6 - (uint)bVar7 & 0xffff) >> 0xf) + ((uint)bVar6 - (uint)bVar7) &
                     0xffff) >> 1;
            fVar8 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::count(pbVar11);
            if ((byte)(fVar8 - 1) < (byte)uVar12) {
              uVar12 = (uint)(byte)(fVar8 - 1);
            }
            btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            ::rebalance_left_to_right
                      (pbVar11,(field_type)uVar12,
                       (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                        *)iter->node_,(allocator_type *)&this->rightmost_);
            iter->position_ = iter->position_ + (uVar12 & 0xff);
            return false;
          }
          if (((ulong)iter->node_ & 7) == 0) {
            if ((int)(uint)(byte)iter->node_[10] <= iter->position_) {
              return false;
            }
            goto LAB_00217ce5;
          }
        }
      }
    }
  }
LAB_00217d56:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descripto..." /* TRUNCATED STRING LITERAL */
  ;
LAB_00217d82:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

bool btree<P>::try_merge_or_rebalance(iterator *iter) {
  node_type *parent = iter->node_->parent();
  if (iter->node_->position() > parent->start()) {
    // Try merging with our left sibling.
    node_type *left = parent->child(iter->node_->position() - 1);
    assert(left->max_count() == kNodeSlots);
    if (1U + left->count() + iter->node_->count() <= kNodeSlots) {
      iter->position_ += 1 + left->count();
      merge_nodes(left, iter->node_);
      iter->node_ = left;
      return true;
    }
  }
  if (iter->node_->position() < parent->finish()) {
    // Try merging with our right sibling.
    node_type *right = parent->child(iter->node_->position() + 1);
    assert(right->max_count() == kNodeSlots);
    if (1U + iter->node_->count() + right->count() <= kNodeSlots) {
      merge_nodes(iter->node_, right);
      return true;
    }
    // Try rebalancing with our right sibling. We don't perform rebalancing if
    // we deleted the first element from iter->node_ and the node is not
    // empty. This is a small optimization for the common pattern of deleting
    // from the front of the tree.
    if (right->count() > kMinNodeValues &&
        (iter->node_->count() == 0 || iter->position_ > iter->node_->start())) {
      field_type to_move = (right->count() - iter->node_->count()) / 2;
      to_move =
          (std::min)(to_move, static_cast<field_type>(right->count() - 1));
      iter->node_->rebalance_right_to_left(to_move, right, mutable_allocator());
      return false;
    }
  }
  if (iter->node_->position() > parent->start()) {
    // Try rebalancing with our left sibling. We don't perform rebalancing if
    // we deleted the last element from iter->node_ and the node is not
    // empty. This is a small optimization for the common pattern of deleting
    // from the back of the tree.
    node_type *left = parent->child(iter->node_->position() - 1);
    if (left->count() > kMinNodeValues &&
        (iter->node_->count() == 0 ||
         iter->position_ < iter->node_->finish())) {
      field_type to_move = (left->count() - iter->node_->count()) / 2;
      to_move = (std::min)(to_move, static_cast<field_type>(left->count() - 1));
      left->rebalance_left_to_right(to_move, iter->node_, mutable_allocator());
      iter->position_ += to_move;
      return false;
    }
  }
  return false;
}